

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O1

void Cmd_End(Abc_Frame_t *pAbc)

{
  Vec_Ptr_t *__ptr;
  int iVar1;
  st__generator *psVar2;
  long lVar3;
  char *pValue;
  char *pKey;
  Abc_Command *local_30;
  char *local_28;
  
  Cmd_HistoryWrite(pAbc,1000000000);
  psVar2 = st__init_gen(pAbc->tCommands);
  iVar1 = st__gen(psVar2,&local_28,(char **)&local_30);
  if (iVar1 != 0) {
    do {
      CmdCommandFree(local_30);
      iVar1 = st__gen(psVar2,&local_28,(char **)&local_30);
    } while (iVar1 != 0);
  }
  st__free_gen(psVar2);
  st__free_table(pAbc->tCommands);
  psVar2 = st__init_gen(pAbc->tAliases);
  iVar1 = st__gen(psVar2,&local_28,(char **)&local_30);
  if (iVar1 != 0) {
    do {
      CmdCommandAliasFree((Abc_Alias *)local_30);
      iVar1 = st__gen(psVar2,&local_28,(char **)&local_30);
    } while (iVar1 != 0);
  }
  st__free_gen(psVar2);
  st__free_table(pAbc->tAliases);
  psVar2 = st__init_gen(pAbc->tFlags);
  iVar1 = st__gen(psVar2,&local_28,(char **)&local_30);
  if (iVar1 != 0) {
    do {
      if (local_28 != (char *)0x0) {
        free(local_28);
        local_28 = (char *)0x0;
      }
      if (local_30 != (Abc_Command *)0x0) {
        free(local_30);
        local_30 = (Abc_Command *)0x0;
      }
      iVar1 = st__gen(psVar2,&local_28,(char **)&local_30);
    } while (iVar1 != 0);
  }
  st__free_gen(psVar2);
  st__free_table(pAbc->tFlags);
  __ptr = pAbc->aHistory;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (0 < __ptr->nSize) {
      lVar3 = 0;
      do {
        if ((void *)0x2 < __ptr->pArray[lVar3]) {
          free(__ptr->pArray[lVar3]);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    free(__ptr);
  }
  return;
}

Assistant:

void Cmd_End( Abc_Frame_t * pAbc )
{
    st__generator * gen;
    char * pKey, * pValue;
    Cmd_HistoryWrite( pAbc, ABC_INFINITY );

//    st__free_table( pAbc->tCommands, (void (*)()) 0, CmdCommandFree );
//    st__free_table( pAbc->tAliases,  (void (*)()) 0, CmdCommandAliasFree );
//    st__free_table( pAbc->tFlags,    free, free );

    st__foreach_item( pAbc->tCommands, gen, (const char **)&pKey, (char **)&pValue )
        CmdCommandFree( (Abc_Command *)pValue );
    st__free_table( pAbc->tCommands );

    st__foreach_item( pAbc->tAliases, gen, (const char **)&pKey, (char **)&pValue )
        CmdCommandAliasFree( (Abc_Alias *)pValue );
    st__free_table( pAbc->tAliases );

    st__foreach_item( pAbc->tFlags, gen, (const char **)&pKey, (char **)&pValue )
        ABC_FREE( pKey ), ABC_FREE( pValue );
    st__free_table( pAbc->tFlags );

    Vec_PtrFreeFree( pAbc->aHistory );
}